

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.h
# Opt level: O3

void __thiscall
cm::uv_handle_ptr_base_<uv_handle_s>::~uv_handle_ptr_base_(uv_handle_ptr_base_<uv_handle_s> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  p_Var1 = (this->handle).super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->handle).super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->handle).super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    p_Var1 = (this->handle).super___shared_ptr<uv_handle_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      return;
    }
  }
  return;
}

Assistant:

~uv_handle_ptr_base_() { this->reset(); }